

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall AGSSock::Buffer::extract(Buffer *this)

{
  _Elt_pointer pbVar1;
  long lVar2;
  
  pbVar1 = (this->queue_).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar2 = std::__cxx11::string::find((char)pbVar1,0);
  if (lVar2 != -1) {
    std::__cxx11::string::find_first_not_of((char)pbVar1,0);
    std::__cxx11::string::erase((ulong)pbVar1,0);
    if (pbVar1->_M_string_length != 0) {
      return;
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  return;
}

Assistant:

void Buffer::extract()
{
	// Not checked for empty
	string &buffer = queue_.front();
	size_t pos = buffer.find_first_of('\0');
	if (pos == string::npos)
		queue_.pop();
	else
	{
		pos = buffer.find_first_not_of('\0', pos);
		buffer.erase(0, pos);
		// Empty strings should only be generated by the sockets API
		if (buffer.empty())
			queue_.pop();
	}
}